

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

void __thiscall ObjectFile::~ObjectFile(ObjectFile *this)

{
  pointer pcVar1;
  MutexFactory *this_00;
  
  (this->super_OSObject)._vptr_OSObject = (_func_int **)&PTR__ObjectFile_0019da50;
  discardAttributes(this);
  if (this->gen != (Generation *)0x0) {
    (*this->gen->_vptr_Generation[1])();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->objectMutex);
  pcVar1 = (this->lockpath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lockpath).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::~_Rb_tree(&(this->attributes)._M_t);
  pcVar1 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ObjectFile::~ObjectFile()
{
	discardAttributes();

	if (gen != NULL)
	{
		delete gen;
	}

	MutexFactory::i()->recycleMutex(objectMutex);
}